

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_content_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_b7931c::ScreenContentToolsTestLarge::ScreenContentToolsTestLarge
          (ScreenContentToolsTestLarge *this)

{
  ParamType *pPVar1;
  
  testing::Test::Test((Test *)this);
  (this->super_CodecTestWith2Params<libaom_test::TestMode,_aom_rc_mode>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_rc_mode>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_01013f00;
  (this->super_CodecTestWith2Params<libaom_test::TestMode,_aom_rc_mode>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_rc_mode>_>
  .
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_rc_mode>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__CodecTestWith2Params_01013f40;
  pPVar1 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_rc_mode>_>
           ::GetParam();
  (this->super_EncoderTest).codec_ =
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_rc_mode>
       ).super__Head_base<0UL,_const_libaom_test::CodecFactory_*,_false>._M_head_impl;
  (this->super_EncoderTest).abort_ = false;
  (this->super_EncoderTest).stats_.buffer_._M_dataplus._M_p =
       (pointer)&(this->super_EncoderTest).stats_.buffer_.field_2;
  (this->super_EncoderTest).stats_.buffer_._M_string_length = 0;
  (this->super_EncoderTest).stats_.buffer_.field_2._M_local_buf[0] = '\0';
  (this->super_EncoderTest).init_flags_ = 0;
  (this->super_EncoderTest).frame_flags_ = 0;
  (this->super_EncoderTest).mode_ = kRealTime;
  (this->super_EncoderTest).cfg_.g_threads = 1;
  (this->super_CodecTestWith2Params<libaom_test::TestMode,_aom_rc_mode>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_rc_mode>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__ScreenContentToolsTestLarge_01013ab0;
  (this->super_CodecTestWith2Params<libaom_test::TestMode,_aom_rc_mode>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_rc_mode>_>
  .
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_rc_mode>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__ScreenContentToolsTestLarge_01013b08;
  (this->super_EncoderTest)._vptr_EncoderTest =
       (_func_int **)&PTR__ScreenContentToolsTestLarge_01013b28;
  pPVar1 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_rc_mode>_>
           ::GetParam();
  *(TestMode *)&(this->super_EncoderTest).field_0x3dc =
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_rc_mode>
       ).super__Tuple_impl<1UL,_libaom_test::TestMode,_aom_rc_mode>.
       super__Head_base<1UL,_libaom_test::TestMode,_false>._M_head_impl;
  pPVar1 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_rc_mode>_>
           ::GetParam();
  this->rc_end_usage_ =
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_rc_mode>
       ).super__Tuple_impl<1UL,_libaom_test::TestMode,_aom_rc_mode>.
       super__Tuple_impl<2UL,_aom_rc_mode>.super__Head_base<2UL,_aom_rc_mode,_false>._M_head_impl;
  this->is_screen_content_violated_ = true;
  this->tune_content_ = 0;
  return;
}

Assistant:

ScreenContentToolsTestLarge()
      : EncoderTest(GET_PARAM(0)), encoding_mode_(GET_PARAM(1)),
        rc_end_usage_(GET_PARAM(2)) {
    is_screen_content_violated_ = true;
    tune_content_ = AOM_CONTENT_DEFAULT;
  }